

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

int libssh2_sftp_posix_rename_ex
              (LIBSSH2_SFTP *sftp,char *source_filename,size_t source_filename_len,
              char *dest_filename,size_t dest_filename_len)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  time_t start_time;
  ulong uVar5;
  uchar *buf;
  ulong uVar6;
  char *errmsg;
  uchar *s;
  size_t data_len;
  uchar *local_78;
  uchar *local_70;
  uint32_t local_64;
  size_t local_60;
  size_t local_58;
  char *local_50;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    return -0x27;
  }
  local_50 = source_filename;
  local_40 = dest_filename;
  start_time = time((time_t *)0x0);
  local_60 = source_filename_len + dest_filename_len + 0x2d;
  uVar5 = dest_filename_len | source_filename_len | local_60;
  local_64 = (int)local_60 - 4;
  local_48 = source_filename_len;
  local_38 = dest_filename_len;
  do {
    channel = sftp->channel;
    pLVar1 = channel->session;
    local_58 = 0;
    local_70 = (uchar *)0x0;
    if (sftp->posix_rename_version == 1) {
      if (uVar5 >> 0x20 != 0) {
        iVar3 = -0x29;
        errmsg = "Input too largeposix-rename@openssh.com";
        goto LAB_00127317;
      }
      if (sftp->posix_rename_state == libssh2_NB_state_idle) {
        buf = (uchar *)(*pLVar1->alloc)(local_60,&pLVar1->abstract);
        local_78 = buf;
        if (buf != (uchar *)0x0) {
          _libssh2_store_u32(&local_78,local_64);
          *local_78 = 200;
          uVar4 = sftp->request_id;
          sftp->request_id = uVar4 + 1;
          sftp->posix_rename_request_id = uVar4;
          local_78 = local_78 + 1;
          _libssh2_store_u32(&local_78,uVar4);
          _libssh2_store_str(&local_78,"posix-rename@openssh.com",0x18);
          _libssh2_store_str(&local_78,local_50,local_48);
          _libssh2_store_str(&local_78,local_40,local_38);
          sftp->posix_rename_state = libssh2_NB_state_created;
          goto LAB_00127411;
        }
        iVar3 = _libssh2_error(pLVar1,-6,"Unable to allocate memory for FXP_EXTENDED packet");
      }
      else {
        buf = sftp->posix_rename_packet;
LAB_00127411:
        sVar2 = local_60;
        if (sftp->posix_rename_state == libssh2_NB_state_created) {
          uVar6 = _libssh2_channel_write(channel,0,buf,local_60);
          if (uVar6 == 0xffffffffffffffdb || uVar6 < sVar2) {
            sftp->posix_rename_packet = buf;
            iVar3 = -0x25;
          }
          else {
            (*pLVar1->free)(buf,&pLVar1->abstract);
            sftp->posix_rename_packet = (uchar *)0x0;
            if (-1 < (long)uVar6) {
              sftp->posix_rename_state = libssh2_NB_state_sent;
              goto LAB_00127488;
            }
            sftp->posix_rename_state = libssh2_NB_state_idle;
            iVar3 = _libssh2_error(pLVar1,-7,"_libssh2_channel_write() failed");
          }
        }
        else {
LAB_00127488:
          iVar3 = sftp_packet_require(sftp,'e',sftp->posix_rename_request_id,&local_70,&local_58,9);
          if (iVar3 == 0) {
            sftp->posix_rename_state = libssh2_NB_state_idle;
            uVar4 = _libssh2_ntohu32(local_70 + 5);
            (*pLVar1->free)(local_70,&pLVar1->abstract);
            if (uVar4 != 0) {
              sftp->last_errno = uVar4;
              iVar3 = -0x1f;
              errmsg = "posix_rename failed";
              goto LAB_00127317;
            }
            iVar3 = 0;
          }
          else if (iVar3 != -0x25) {
            if (iVar3 == -0x26) {
              if (local_58 != 0) {
                (*pLVar1->free)(local_70,&pLVar1->abstract);
              }
              iVar3 = -0x1f;
              errmsg = "SFTP posix_rename packet too short";
            }
            else {
              sftp->posix_rename_state = libssh2_NB_state_idle;
              errmsg = "Error waiting for FXP EXTENDED REPLY";
            }
            goto LAB_00127317;
          }
        }
      }
    }
    else {
      iVar3 = 8;
      errmsg = "Server does not supportposix-rename@openssh.com";
LAB_00127317:
      iVar3 = _libssh2_error(pLVar1,iVar3,errmsg);
    }
    if (iVar3 != -0x25) {
      return iVar3;
    }
    pLVar1 = sftp->channel->session;
    if (pLVar1 == (LIBSSH2_SESSION *)0x0) {
      return -0x25;
    }
    if (pLVar1->api_block_mode == 0) {
      return -0x25;
    }
    iVar3 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar3 != 0) {
      return iVar3;
    }
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_sftp_posix_rename_ex(LIBSSH2_SFTP *sftp, const char *source_filename,
                             size_t source_filename_len,
                             const char *dest_filename,
                             size_t dest_filename_len)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_posix_rename(sftp, source_filename, source_filename_len,
                                   dest_filename, dest_filename_len));
    return rc;
}